

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O0

string * chaiscript::ChaiScript_Basic::load_file(string *__return_storage_ptr__,string *t_filename)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  char *pcVar4;
  file_not_found_error *this;
  streamoff sVar5;
  size_type __n;
  reference pvVar6;
  undefined1 auVar7 [16];
  allocator<char> local_289;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_288;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_280;
  allocator_type local_271;
  undefined1 local_270 [8];
  vector<char,_std::allocator<char>_> v;
  fpos<__mbstate_t> local_250;
  undefined1 local_240 [8];
  pos_type size;
  ifstream local_220 [8];
  ifstream infile;
  string *t_filename_local;
  
  pcVar4 = Catch::clara::std::__cxx11::
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str(t_filename);
  _Var3 = Catch::clara::std::operator|(_S_in,_S_ate);
  _Var3 = Catch::clara::std::operator|(_Var3,_S_bin);
  std::ifstream::ifstream(local_220,pcVar4,_Var3);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    this = (file_not_found_error *)__cxa_allocate_exception(0x30);
    exception::file_not_found_error::file_not_found_error(this,t_filename);
    __cxa_throw(this,&exception::file_not_found_error::typeinfo,
                exception::file_not_found_error::~file_not_found_error);
  }
  auVar7 = std::istream::tellg();
  size._M_off = auVar7._8_8_;
  local_240 = auVar7._0_8_;
  std::istream::seekg((long)local_220,_S_beg);
  sVar5 = std::fpos::operator_cast_to_long((fpos *)local_240);
  if (sVar5 < 0) {
    __assert_fail("size >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/language/chaiscript_engine.hpp"
                  ,0xd6,
                  "static std::string chaiscript::ChaiScript_Basic::load_file(const std::string &)")
    ;
  }
  bVar2 = skip_bom(local_220);
  if (bVar2) {
    Catch::clara::std::fpos<__mbstate_t>::operator-=((fpos<__mbstate_t> *)local_240,3);
    sVar5 = std::fpos::operator_cast_to_long((fpos *)local_240);
    if (sVar5 < 0) {
      __assert_fail("size >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/language/chaiscript_engine.hpp"
                    ,0xda,
                    "static std::string chaiscript::ChaiScript_Basic::load_file(const std::string &)"
                   );
    }
  }
  Catch::clara::std::fpos<__mbstate_t>::fpos(&local_250,0);
  bVar2 = std::operator==((fpos<__mbstate_t> *)local_240,&local_250);
  if (bVar2) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    v.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 1;
  }
  else {
    __n = std::fpos::operator_cast_to_long((fpos *)local_240);
    std::allocator<char>::allocator();
    Catch::clara::std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_270,__n,&local_271);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    pvVar6 = Catch::clara::std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_270,0);
    std::fpos::operator_cast_to_long((fpos *)local_240);
    std::istream::read((char *)local_220,(long)pvVar6);
    local_280._M_current =
         (char *)Catch::clara::std::vector<char,_std::allocator<char>_>::begin
                           ((vector<char,_std::allocator<char>_> *)local_270);
    local_288._M_current =
         (char *)Catch::clara::std::vector<char,_std::allocator<char>_>::end
                           ((vector<char,_std::allocator<char>_> *)local_270);
    std::allocator<char>::allocator();
    std::__cxx11::string::
    string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((string *)__return_storage_ptr__,local_280,local_288,&local_289);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
    v.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 1;
    Catch::clara::std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_270);
  }
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

static std::string load_file(const std::string &t_filename) {
      std::ifstream infile(t_filename.c_str(), std::ios::in | std::ios::ate | std::ios::binary);

      if (!infile.is_open()) {
        throw chaiscript::exception::file_not_found_error(t_filename);
      }

      auto size = infile.tellg();
      infile.seekg(0, std::ios::beg);

      assert(size >= 0);

      if (skip_bom(infile)) {
        size -= 3; // decrement the BOM size from file size, otherwise we'll get parsing errors
        assert(size >= 0); // and check if there's more text
      }

      if (size == std::streampos(0)) {
        return std::string();
      } else {
        std::vector<char> v(static_cast<size_t>(size));
        infile.read(&v[0], static_cast<std::streamsize>(size));
        return std::string(v.begin(), v.end());
      }
    }